

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

int __thiscall
TasGrid::GridLocalPolynomial::removePointsByHierarchicalCoefficient
          (GridLocalPolynomial *this,double tolerance,int output,double *scale_correction)

{
  uint uVar1;
  int iVar2;
  ulong *puVar3;
  pointer scale_correction_00;
  ulong uVar4;
  ulong uVar5;
  size_type __n;
  reference rVar6;
  allocator_type local_92;
  allocator_type local_91;
  double local_90;
  double local_88;
  _Vector_base<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> rescaled;
  vector<bool,_std::allocator<bool>_> pmap;
  
  local_90 = tolerance;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  scale_correction_00 = scale_correction;
  if (scale_correction == (double *)0x0) {
    iVar2 = 1;
    if (output == -1) {
      iVar2 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    pmap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x3ff0000000000000;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_80,(long)(int)(iVar2 * uVar1),
               (value_type_conflict2 *)&pmap,&local_91);
    scale_correction_00 = local_80._M_impl.super__Vector_impl_data._M_start;
  }
  getScaledCoefficients(&rescaled,this,output,scale_correction_00);
  if (scale_correction == (double *)0x0) {
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_80);
  }
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&pmap,(long)(int)uVar1,&local_92);
  __n = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = __n;
  }
  for (; uVar5 != __n; __n = __n + 1) {
    local_88 = rescaled.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[__n];
    rVar6 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&pmap,__n);
    puVar3 = rVar6._M_p;
    if (local_88 <= local_90) {
      uVar4 = ~rVar6._M_mask & *puVar3;
    }
    else {
      uVar4 = rVar6._M_mask | *puVar3;
    }
    *puVar3 = uVar4;
  }
  iVar2 = removeMappedPoints(this,&pmap);
  ::std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&pmap);
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&rescaled);
  return iVar2;
}

Assistant:

int GridLocalPolynomial::removePointsByHierarchicalCoefficient(double tolerance, int output, const double *scale_correction){
    clearRefinement();
    int num_points = points.getNumIndexes();

    int active_outputs = (output == -1) ? num_outputs : 1;
    std::vector<double> rescaled = getScaledCoefficients(output, (scale_correction == nullptr) ?
                                        std::vector<double>(num_points * active_outputs, 1.0).data() : scale_correction);

    std::vector<bool> pmap(num_points); // point map, set to true if the point is to be kept, false otherwise
    for(int i=0; i<num_points; i++) pmap[i] = (rescaled[i] > tolerance);

    return removeMappedPoints(pmap);
}